

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall
cppcms::application::add(application *this,application *app,string *name,string *url)

{
  application *paVar1;
  application *in_R8;
  void *in_R9;
  
  if (app->parent_ != this) {
    app->parent_ = this;
    paVar1 = this->root_;
    in_R8 = paVar1->root_;
    if (paVar1 != in_R8) {
      do {
        paVar1 = in_R8;
        this->root_ = paVar1;
        in_R8 = paVar1->root_;
      } while (in_R8 != paVar1);
    }
    app->root_ = paVar1;
  }
  url_mapper::mount((((this->d).ptr_)->url_map).ptr_,(char *)name,(char *)url,(char *)app,
                    (ulong)in_R8,in_R9);
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url)
{
	add(app);
	mapper().mount(name,url,app);
}